

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,basic_string_view<char> value)

{
  error_handler local_19;
  
  check_string_type_spec<char,fmt::v5::internal::error_handler>(this->specs_->type_,&local_19);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write_str<char>
            (&this->writer_,value,this->specs_);
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    internal::check_string_type_spec(specs_.type_, internal::error_handler());
    writer_.write_str(value, specs_);
    return out();
  }